

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_false>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,__1,_1,_true,_true>
                  *this,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>
                        *xpr,Index i)

{
  long lVar1;
  PointerType pdVar2;
  long lVar3;
  Nested pMVar4;
  Index IVar5;
  
  MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_false>,_-1,_1,_true>,_0>
  ::MapBase((MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,__1,_1,_true>,_0>
             *)this,(xpr->
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
                    .m_data + i * (xpr->
                                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
                                  ).
                                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
                                  .m_outerStride,
            (xpr->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
            .m_rows.m_value,1);
  lVar1 = (xpr->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
  .m_data = (xpr->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
            .m_data;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false>,_0>
  .m_rows.m_value = lVar1;
  pdVar2 = (xpr->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
           .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.
           m_data;
  lVar1 = ((variable_if_dynamic<long,__1> *)
          ((long)&(xpr->
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
                  .m_xpr.
                  super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
          + 8))->m_value;
  lVar3 = ((variable_if_dynamic<long,__1> *)
          ((long)&(xpr->
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
                  .m_xpr.
                  super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>
          + 0x10))->m_value;
  pMVar4 = (xpr->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
           .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.m_xpr;
  IVar5 = (xpr->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
          .m_outerStride;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.m_outerStride =
       (xpr->
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
       .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
       m_outerStride;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .m_outerStride = IVar5;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_data =
       pdVar2;
  ((variable_if_dynamic<long,__1> *)
  ((long)&(this->m_xpr).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
          .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1> + 8))
  ->m_value = lVar1;
  ((variable_if_dynamic<long,__1> *)
  ((long)&(this->m_xpr).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
          .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1> + 0x10
  ))->m_value = lVar3;
  (this->m_xpr).
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.m_xpr = pMVar4;
  this->m_outerStride =
       (this->m_xpr).
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_false,_true>
       .m_outerStride;
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }